

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * substExpr(sqlite3 *db,Expr *pExpr,int iTable,ExprList *pEList)

{
  Expr *pEVar1;
  Expr *pNew;
  ExprList *pEList_local;
  sqlite3 *psStack_20;
  int iTable_local;
  Expr *pExpr_local;
  sqlite3 *db_local;
  
  if (pExpr == (Expr *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    psStack_20 = (sqlite3 *)pExpr;
    if ((pExpr->op == 0x98) && (pExpr->iTable == iTable)) {
      if (pExpr->iColumn < 0) {
        pExpr->op = 'b';
      }
      else {
        psStack_20 = (sqlite3 *)sqlite3ExprDup(db,pEList->a[pExpr->iColumn].pExpr,0);
        sqlite3ExprDelete(db,pExpr);
      }
    }
    else {
      pEVar1 = substExpr(db,pExpr->pLeft,iTable,pEList);
      pExpr->pLeft = pEVar1;
      pEVar1 = substExpr(db,pExpr->pRight,iTable,pEList);
      pExpr->pRight = pEVar1;
      if ((pExpr->flags & 0x800) == 0x800) {
        substSelect(db,(pExpr->x).pSelect,iTable,pEList);
      }
      else {
        substExprList(db,(pExpr->x).pList,iTable,pEList);
      }
    }
    db_local = psStack_20;
  }
  return (Expr *)db_local;
}

Assistant:

static Expr *substExpr(
  sqlite3 *db,        /* Report malloc errors to this connection */
  Expr *pExpr,        /* Expr in which substitution occurs */
  int iTable,         /* Table to be substituted */
  ExprList *pEList    /* Substitute expressions */
){
  if( pExpr==0 ) return 0;
  if( pExpr->op==TK_COLUMN && pExpr->iTable==iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      assert( pEList!=0 && pExpr->iColumn<pEList->nExpr );
      assert( pExpr->pLeft==0 && pExpr->pRight==0 );
      pNew = sqlite3ExprDup(db, pEList->a[pExpr->iColumn].pExpr, 0);
      sqlite3ExprDelete(db, pExpr);
      pExpr = pNew;
    }
  }else{
    pExpr->pLeft = substExpr(db, pExpr->pLeft, iTable, pEList);
    pExpr->pRight = substExpr(db, pExpr->pRight, iTable, pEList);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(db, pExpr->x.pSelect, iTable, pEList);
    }else{
      substExprList(db, pExpr->x.pList, iTable, pEList);
    }
  }
  return pExpr;
}